

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalarestimator.cxx
# Opt level: O3

int __thiscall ScalarEstimator::init(ScalarEstimator *this,EVP_PKEY_CTX *ctx)

{
  void *pvVar1;
  
  (this->super_Estimator).nSamples = 0;
  this->dSample = 0.0;
  this->dOne = 0.0;
  this->dTwo = 0.0;
  this->dThree = 0.0;
  if ((this->aDist != (double *)0x0) && (0 < (long)this->nDist)) {
    pvVar1 = memset(this->aDist,0,(long)this->nDist << 3);
    return (int)pvVar1;
  }
  return (int)this;
}

Assistant:

void ScalarEstimator::init()
{
	nSamples = 0;
	dSample = 0.0;
	dOne = 0.0;
	dTwo = 0.0;
	dThree = 0.0;
	if(aDist)
		for(int i=0; i<nDist; i++)
			aDist[i] = 0.0;
}